

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O0

void __thiscall libDAI::FactorGraph::backupFactors(FactorGraph *this,VarSet *ns)

{
  bool bVar1;
  ulong uVar2;
  TFactor<double> *this_00;
  long *in_RDI;
  size_t I;
  size_t in_stack_00000038;
  FactorGraph *in_stack_00000040;
  ulong local_18;
  
  for (local_18 = 0; uVar2 = (**(code **)(*in_RDI + 0x48))(), local_18 < uVar2;
      local_18 = local_18 + 1) {
    this_00 = (TFactor<double> *)(**(code **)(*in_RDI + 0x50))(in_RDI,local_18);
    TFactor<double>::vars(this_00);
    bVar1 = VarSet::operator&&((VarSet *)this,ns);
    if (bVar1) {
      backupFactor(in_stack_00000040,in_stack_00000038);
    }
  }
  return;
}

Assistant:

void FactorGraph::backupFactors( const VarSet &ns ) {
        for( size_t I = 0; I < nrFactors(); I++ )
            if( factor(I).vars() && ns )
                backupFactor( I );
    }